

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizer.c
# Opt level: O2

Real * ZBufferGetDepth(Real *__return_storage_ptr__,ZBuffer *zbuffer,uint16_t x,uint16_t y)

{
  ushort uVar1;
  int iVar2;
  undefined4 extraout_var;
  
  uVar1 = *(ushort *)((long)__return_storage_ptr__ + 2);
  if (((ushort)((ulong)zbuffer & 0xffffffff) < *(ushort *)__return_storage_ptr__) && (x < uVar1)) {
    return (Real *)((ulong)((uint)uVar1 * (uint)x + (int)zbuffer) << 4);
  }
  iVar2 = fprintf(_stderr,"%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n","ZBufferGetDepth",
                  (ulong)zbuffer & 0xffffffff,(ulong)*(ushort *)__return_storage_ptr__,x,(uint)uVar1
                 );
  return (Real *)CONCAT44(extraout_var,iVar2);
}

Assistant:

Real ZBufferGetDepth(const ZBuffer *zbuffer, uint16_t x, uint16_t y) {
  if (zbuffer->imageWidth <= x || zbuffer->imageHeight <= y) {
#ifndef NDEBUG
    fprintf(stderr, "%s: Invalid depth indices (x:%d<%d, y:%d<%d)\n", __FUNCTION_NAME__, x, zbuffer->imageWidth, y, zbuffer->imageHeight);
#endif
    return DBL_MIN;
  }
  Real depth;
  depth = zbuffer->depths[x + zbuffer->imageHeight * y];
  return depth;
}